

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O1

Vec_Int_t * Cbs2_ManSolveMiterNc(Gia_Man_t *pAig,int nConfs,Vec_Str_t **pvStatus,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Vec_Str_t **ppVVar5;
  int iVar6;
  Cbs2_Man_t *p;
  Vec_Str_t *pVVar7;
  char *pcVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  undefined8 *puVar11;
  void *pvVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  size_t sVar17;
  Vec_Int_t *vCex;
  timespec ts;
  timespec local_70;
  Vec_Int_t *local_60;
  Vec_Int_t *local_58;
  int local_4c;
  long local_48;
  undefined8 *local_40;
  Vec_Str_t **local_38;
  
  iVar6 = clock_gettime(3,&local_70);
  if (iVar6 < 0) {
    local_48 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
    local_48 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_70.tv_sec * -1000000;
  }
  if (pAig->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x621,"Vec_Int_t *Cbs2_ManSolveMiterNc(Gia_Man_t *, int, Vec_Str_t **, int)");
  }
  Gia_ManCreateRefs(pAig);
  p = Cbs2_ManAlloc(pAig);
  (p->Pars).nBTLimit = nConfs;
  iVar16 = pAig->vCos->nSize - pAig->nRegs;
  pVVar7 = (Vec_Str_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar16 - 1U) {
    iVar6 = iVar16;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar6;
  local_4c = fVerbose;
  local_38 = pvStatus;
  if (iVar6 == 0) {
    pcVar8 = (char *)0x0;
  }
  else {
    pcVar8 = (char *)malloc((long)iVar6);
  }
  pVVar7->pArray = pcVar8;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 10000;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(40000);
  pVVar9->pArray = piVar10;
  local_58 = pVVar9;
  puVar11 = (undefined8 *)malloc(0x10);
  *puVar11 = 100;
  pvVar12 = malloc(400);
  puVar11[1] = pvVar12;
  pVVar9 = pAig->vCos;
  local_40 = puVar11;
  if (0 < pVVar9->nSize) {
    vCex = p->vModel;
    lVar13 = 0;
    local_60 = vCex;
    do {
      iVar6 = pVVar9->pArray[lVar13];
      if (((long)iVar6 < 0) || (pAig->nObjs <= iVar6)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = pAig->pObjs + iVar6;
      vCex->nSize = 0;
      iVar6 = (int)lVar13;
      if ((~*(ulong *)(pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)) &
          0x1fffffff1fffffff) == 0) {
        if (((uint)*(undefined8 *)pGVar1 >> 0x1d & 1) == 0) {
          uVar2 = pVVar7->nCap;
          if (pVVar7->nSize == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar7->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(0x10);
              }
              else {
                pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
              }
              sVar17 = 0x10;
            }
            else {
              sVar17 = (ulong)uVar2 * 2;
              if ((int)sVar17 <= (int)uVar2) goto LAB_006e90f0;
              if (pVVar7->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(sVar17);
              }
              else {
                pcVar8 = (char *)realloc(pVVar7->pArray,sVar17);
              }
            }
            pVVar7->pArray = pcVar8;
            pVVar7->nCap = (int)sVar17;
          }
LAB_006e90f0:
          iVar6 = pVVar7->nSize;
          pVVar7->nSize = iVar6 + 1;
          pVVar7->pArray[iVar6] = '\x01';
        }
        else {
          Cec_ManSatAddToStore(local_58,vCex,iVar6);
          uVar2 = pVVar7->nCap;
          if (pVVar7->nSize == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar7->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(0x10);
              }
              else {
                pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
              }
              sVar17 = 0x10;
            }
            else {
              sVar17 = (ulong)uVar2 * 2;
              if ((int)sVar17 <= (int)uVar2) goto LAB_006e911e;
              if (pVVar7->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(sVar17);
              }
              else {
                pcVar8 = (char *)realloc(pVVar7->pArray,sVar17);
              }
            }
            pVVar7->pArray = pcVar8;
            pVVar7->nCap = (int)sVar17;
          }
LAB_006e911e:
          iVar6 = pVVar7->nSize;
          pVVar7->nSize = iVar6 + 1;
          pVVar7->pArray[iVar6] = '\0';
        }
      }
      else {
        iVar16 = clock_gettime(3,&local_70);
        if (iVar16 < 0) {
          lVar14 = 1;
        }
        else {
          lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
          lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_70.tv_sec * -1000000;
        }
        (p->Pars).fUseHighest = 1;
        (p->Pars).fUseLowest = 0;
        Gia_ManIncrementTravId(pAig);
        pGVar4 = pAig->pObjs;
        if ((pGVar1 < pGVar4) || (pGVar4 + pAig->nObjs <= pGVar1)) {
LAB_006e92aa:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Cbs2_ManCreateFanout_rec
                  (p,(int)((ulong)((long)pGVar1 - (long)pGVar4) >> 2) * -0x55555555 -
                     (*(uint *)pGVar1 & 0x1fffffff));
        pGVar4 = pAig->pObjs;
        if ((pGVar1 < pGVar4) || (pGVar4 + pAig->nObjs <= pGVar1)) goto LAB_006e92aa;
        iVar16 = (int)((ulong)((long)pGVar1 - (long)pGVar4) >> 2) * -0x55555555 -
                 (*(uint *)pGVar1 & 0x1fffffff);
        if (iVar16 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        iVar16 = Cbs2_ManSolve(p,(*(uint *)pGVar1 >> 0x1d & 1) + iVar16 * 2);
        pGVar4 = pAig->pObjs;
        if ((pGVar1 < pGVar4) || (pGVar4 + pAig->nObjs <= pGVar1)) goto LAB_006e92aa;
        Cbs2_ManDeleteFanout_rec
                  (p,(int)((ulong)((long)pGVar1 - (long)pGVar4) >> 2) * -0x55555555 -
                     (*(uint *)pGVar1 & 0x1fffffff));
        uVar2 = pVVar7->nCap;
        if (pVVar7->nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar7->pArray == (char *)0x0) {
              pcVar8 = (char *)malloc(0x10);
            }
            else {
              pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
            }
            sVar17 = 0x10;
          }
          else {
            sVar17 = (ulong)uVar2 * 2;
            if ((int)sVar17 <= (int)uVar2) goto LAB_006e8f42;
            if (pVVar7->pArray == (char *)0x0) {
              pcVar8 = (char *)malloc(sVar17);
            }
            else {
              pcVar8 = (char *)realloc(pVVar7->pArray,sVar17);
            }
          }
          pVVar7->pArray = pcVar8;
          pVVar7->nCap = (int)sVar17;
        }
LAB_006e8f42:
        vCex = local_60;
        iVar3 = pVVar7->nSize;
        pVVar7->nSize = iVar3 + 1;
        pVVar7->pArray[iVar3] = (char)iVar16;
        if (iVar16 == 1) {
          p->nSatUnsat = p->nSatUnsat + 1;
          p->nConfUnsat = p->nConfUnsat + (p->Pars).nBTThis;
          iVar6 = clock_gettime(3,&local_70);
          if (iVar6 < 0) {
            lVar15 = -1;
          }
          else {
            lVar15 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
          }
          p->timeSatUnsat = p->timeSatUnsat + lVar15 + lVar14;
          vCex = local_60;
        }
        else if (iVar16 == -1) {
          p->nSatUndec = p->nSatUndec + 1;
          p->nConfUndec = p->nConfUndec + (p->Pars).nBTThis;
          Cec_ManSatAddToStore(local_58,(Vec_Int_t *)0x0,iVar6);
          iVar6 = clock_gettime(3,&local_70);
          if (iVar6 < 0) {
            lVar15 = -1;
          }
          else {
            lVar15 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
          }
          p->timeSatUndec = p->timeSatUndec + lVar15 + lVar14;
          vCex = local_60;
        }
        else {
          p->nSatSat = p->nSatSat + 1;
          p->nConfSat = p->nConfSat + (p->Pars).nBTThis;
          Cec_ManSatAddToStore(local_58,local_60,iVar6);
          iVar6 = clock_gettime(3,&local_70);
          if (iVar6 < 0) {
            lVar15 = -1;
          }
          else {
            lVar15 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
          }
          p->timeSatSat = p->timeSatSat + lVar15 + lVar14;
        }
      }
      lVar13 = lVar13 + 1;
      pVVar9 = pAig->vCos;
    } while (lVar13 < pVVar9->nSize);
  }
  puVar11 = local_40;
  if ((void *)local_40[1] != (void *)0x0) {
    free((void *)local_40[1]);
    puVar11[1] = 0;
  }
  free(puVar11);
  p->nSatTotal = pAig->vCos->nSize - pAig->nRegs;
  iVar6 = clock_gettime(3,&local_70);
  ppVVar5 = local_38;
  if (iVar6 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
  }
  p->timeTotal = lVar13 + local_48;
  if (local_4c != 0) {
    Cbs2_ManSatPrintStats(p);
  }
  iVar6 = 0x9f0437;
  printf("Prop1 = %d.  Prop2 = %d.  Prop3 = %d.  ClaConf = %d.   FailJ = %d.  FailC = %d.   ",
         (ulong)(uint)p->nPropCalls[0],(ulong)(uint)p->nPropCalls[1],(ulong)(uint)p->nPropCalls[2],
         (ulong)(uint)p->nClauseConf,(ulong)(uint)p->nFails[0],p->nFails[1]);
  local_60 = (Vec_Int_t *)(double)p->timeJFront;
  Abc_Print(iVar6,"%s =","JFront");
  Abc_Print(iVar6,"%9.2f sec\n",(double)local_60 / 1000000.0);
  Cbs2_ManStop(p);
  *ppVVar5 = pVVar7;
  return local_58;
}

Assistant:

Vec_Int_t * Cbs2_ManSolveMiterNc( Gia_Man_t * pAig, int nConfs, Vec_Str_t ** pvStatus, int fVerbose )
{
    extern void Gia_ManCollectTest( Gia_Man_t * pAig );
    extern void Cec_ManSatAddToStore( Vec_Int_t * vCexStore, Vec_Int_t * vCex, int Out );
    Cbs2_Man_t * p; 
    Vec_Int_t * vCex, * vVisit, * vCexStore;
    Vec_Str_t * vStatus;
    Gia_Obj_t * pRoot; 
    int i, status;
    abctime clk, clkTotal = Abc_Clock();
    assert( Gia_ManRegNum(pAig) == 0 );
//    Gia_ManCollectTest( pAig );
    // prepare AIG
    Gia_ManCreateRefs( pAig );
    //Gia_ManLevelNum( pAig );
    //Gia_ManCleanMark0( pAig );
    //Gia_ManCleanMark1( pAig );
    //Gia_ManFillValue( pAig ); // maps nodes into trail ids
    //Gia_ManSetPhase( pAig ); // maps nodes into trail ids
    // create logic network
    p = Cbs2_ManAlloc( pAig );
    p->Pars.nBTLimit = nConfs;
    // create resulting data-structures
    vStatus   = Vec_StrAlloc( Gia_ManPoNum(pAig) );
    vCexStore = Vec_IntAlloc( 10000 );
    vVisit    = Vec_IntAlloc( 100 );
    vCex      = Cbs2_ReadModel( p );
    // solve for each output
    Gia_ManForEachCo( pAig, pRoot, i )
    {
        //printf( "\nOutput %d\n", i );

        Vec_IntClear( vCex );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pRoot)) )
        {
            if ( Gia_ObjFaninC0(pRoot) )
            {
//                printf( "Constant 1 output of SRM!!!\n" );
                Cec_ManSatAddToStore( vCexStore, vCex, i ); // trivial counter-example
                Vec_StrPush( vStatus, 0 );
            }
            else
            {
//                printf( "Constant 0 output of SRM!!!\n" );
                Vec_StrPush( vStatus, 1 );
            }
            continue;
        }
        clk = Abc_Clock();
        p->Pars.fUseHighest = 1;
        p->Pars.fUseLowest  = 0;

        Gia_ManIncrementTravId( pAig );
        Cbs2_ManCreateFanout_rec( p, Gia_ObjFaninId0p(pAig, pRoot) );
        //Cbs2_ManPrintFanouts( p );

        status = Cbs2_ManSolve( p, Gia_ObjFaninLit0p(pAig, pRoot) );
        //printf( "\n" );

        Cbs2_ManDeleteFanout_rec( p, Gia_ObjFaninId0p(pAig, pRoot) );
        //Cbs2_ManCheckFanouts( p );

/*
        if ( status == -1 )
        {
            p->Pars.fUseHighest = 0;
            p->Pars.fUseLowest  = 1;
            status = Cbs2_ManSolve( p, Gia_ObjChild0(pRoot) );
        }
*/
        Vec_StrPush( vStatus, (char)status );
        if ( status == -1 )
        {
            p->nSatUndec++;
            p->nConfUndec += p->Pars.nBTThis;
            Cec_ManSatAddToStore( vCexStore, NULL, i ); // timeout
            p->timeSatUndec += Abc_Clock() - clk;
            continue;
        }
        if ( status == 1 )
        {
            p->nSatUnsat++;
            p->nConfUnsat += p->Pars.nBTThis;
            p->timeSatUnsat += Abc_Clock() - clk;
            continue;
        }
        p->nSatSat++;
        p->nConfSat += p->Pars.nBTThis;
//        Gia_SatVerifyPattern( pAig, pRoot, vCex, vVisit );
        Cec_ManSatAddToStore( vCexStore, vCex, i );
        p->timeSatSat += Abc_Clock() - clk;
    }
    Vec_IntFree( vVisit );
    p->nSatTotal = Gia_ManPoNum(pAig);
    p->timeTotal = Abc_Clock() - clkTotal;
    if ( fVerbose )
        Cbs2_ManSatPrintStats( p );
//    printf( "RecCalls = %8d.  RecClause = %8d.  RecNonChro = %8d.\n", p->nRecCall, p->nRecClause, p->nRecNonChro );
    printf( "Prop1 = %d.  Prop2 = %d.  Prop3 = %d.  ClaConf = %d.   FailJ = %d.  FailC = %d.   ", p->nPropCalls[0], p->nPropCalls[1], p->nPropCalls[2], p->nClauseConf, p->nFails[0], p->nFails[1] );
    Abc_PrintTime( 1, "JFront", p->timeJFront );

    Cbs2_ManStop( p );
    *pvStatus = vStatus;

//    printf( "Total number of cex literals = %d. (Ave = %d)\n", 
//         Vec_IntSize(vCexStore)-2*p->nSatUndec-2*p->nSatSat, 
//        (Vec_IntSize(vCexStore)-2*p->nSatUndec-2*p->nSatSat)/p->nSatSat );
    return vCexStore;
}